

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDASetStepToleranceIC(void *ida_mem,sunrealtype steptol)

{
  IDAMem in_RDI;
  double in_XMM0_Qa;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x35d,"IDASetStepToleranceIC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (0.0 < in_XMM0_Qa) {
    in_RDI->ida_steptol = in_XMM0_Qa;
    local_4 = 0;
  }
  else {
    IDAProcessError(in_RDI,-0x16,0x365,"IDASetStepToleranceIC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_io.c"
                    ,"steptol <= 0.0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int IDASetStepToleranceIC(void* ida_mem, sunrealtype steptol)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (steptol <= ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_STEPTOL);
    return (IDA_ILL_INPUT);
  }

  IDA_mem->ida_steptol = steptol;

  return (IDA_SUCCESS);
}